

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

void trace_example(void)

{
  shared_ptr<spdlog::logger> logger;
  undefined1 local_550 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  undefined1 local_530 [16];
  executor local_520;
  executor local_370;
  executor local_1c0;
  
  spdlog::details::executor::executor(&local_1c0);
  spdlog::details::executor::~executor(&local_1c0);
  spdlog::details::executor::executor(&local_370);
  spdlog::details::executor::~executor(&local_370);
  local_540._M_allocated_capacity = (size_type)local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_550 + 0x10),"file_logger","");
  spdlog::get((string *)local_550);
  if ((undefined1 *)local_540._M_allocated_capacity != local_530) {
    operator_delete((void *)local_540._M_allocated_capacity);
  }
  spdlog::details::executor::executor(&local_520);
  spdlog::details::executor::~executor(&local_520);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_550._8_8_);
  }
  return;
}

Assistant:

void trace_example()
{
    // trace from default logger
    SPDLOG_TRACE("Some trace message.. {} ,{}", 1, 3.23);
    // debug from default logger
    SPDLOG_DEBUG("Some debug message.. {} ,{}", 1, 3.23);

    // trace from logger object
    auto logger = spdlog::get("file_logger");
    SPDLOG_LOGGER_TRACE(logger, "another trace message");
}